

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O0

RefCount<antlr::LexerInputState> * __thiscall
antlr::RefCount<antlr::LexerInputState>::operator=
          (RefCount<antlr::LexerInputState> *this,RefCount<antlr::LexerInputState> *other)

{
  bool bVar1;
  long *in_RSI;
  RefCount<antlr::LexerInputState> *in_RDI;
  Ref *tmp;
  Ref *this_00;
  Ref *local_28;
  
  if (*in_RSI == 0) {
    local_28 = (Ref *)0x0;
  }
  else {
    local_28 = Ref::increment((Ref *)*in_RSI);
  }
  if (((in_RDI->ref != (Ref *)0x0) && (bVar1 = Ref::decrement(in_RDI->ref), bVar1)) &&
     (this_00 = in_RDI->ref, this_00 != (Ref *)0x0)) {
    Ref::~Ref(this_00);
    operator_delete(this_00,0x10);
  }
  in_RDI->ref = local_28;
  return in_RDI;
}

Assistant:

RefCount<T>& operator=(const RefCount<T>& other)
	{
		Ref* tmp = other.ref ? other.ref->increment() : 0;
		if (ref && ref->decrement())
			delete ref;
		ref = tmp;
		return *this;
	}